

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::
     Test_ParseCommandLineFlagsUsesLastDefinitionTest_WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine
     ::Run(void)

{
  int32 iVar1;
  char *pcVar2;
  FlagSaver fs;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  undefined8 local_18;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUsesLastDefinitionTest",
          "WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine");
  local_38 = "my_test";
  local_30 = "--test_flag=0";
  local_28 = GetFlagFileFlag();
  local_20 = "--test_flag=3";
  local_18 = 0;
  iVar1 = ParseTestFlag(true,4,&local_38);
  if (iVar1 == 3) {
    iVar1 = ParseTestFlag(false,4,&local_38);
    if (iVar1 == 3) {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar2 = "ParseTestFlag(false, (sizeof(argv)/sizeof(*(argv))) - 1, argv)";
  }
  else {
    pcVar2 = "ParseTestFlag(true, (sizeof(argv)/sizeof(*(argv))) - 1, argv)";
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","3","==",pcVar2);
  exit(1);
}

Assistant:

TEST(ParseCommandLineFlagsUsesLastDefinitionTest,
     WhenFlagIsDefinedInCommandLineAndFlagFileAndThenCommandLine) {
  const char* argv[] = {
    "my_test",
    "--test_flag=0",
    GetFlagFileFlag(),
    "--test_flag=3",
    NULL,
  };

  EXPECT_EQ(3, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(3, ParseTestFlag(false, arraysize(argv) - 1, argv));
}